

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O1

void WAsmJs::RegisterSpace::GetTypeDebugName(Types type,char16 *buf,uint bufsize,bool shortName)

{
  short sVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char16_t *pcVar5;
  long lVar6;
  
  uVar4 = (ulong)bufsize;
  bVar2 = bufsize == 0 || buf == (char16 *)0x0;
  uVar3 = uVar4;
  switch(type) {
  case INT32:
    if (bVar2) goto LAB_0096aa82;
    pcVar5 = L"INT32";
    if (shortName) {
      pcVar5 = L"I";
    }
    lVar6 = 0;
    do {
      sVar1 = *(short *)((long)pcVar5 + lVar6);
      *(short *)((long)buf + lVar6) = sVar1;
      if (sVar1 == 0) goto LAB_0096aa3a;
      lVar6 = lVar6 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    break;
  case INT64:
    if (bVar2) goto LAB_0096aa82;
    pcVar5 = L"INT64";
    if (shortName) {
      pcVar5 = L"L";
    }
    lVar6 = 0;
    do {
      sVar1 = *(short *)((long)pcVar5 + lVar6);
      *(short *)((long)buf + lVar6) = sVar1;
      if (sVar1 == 0) goto LAB_0096aa3a;
      lVar6 = lVar6 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    break;
  case FLOAT32:
    if (bVar2) goto LAB_0096aa82;
    pcVar5 = L"FLOAT32";
    if (shortName) {
      pcVar5 = L"F";
    }
    lVar6 = 0;
    do {
      sVar1 = *(short *)((long)pcVar5 + lVar6);
      *(short *)((long)buf + lVar6) = sVar1;
      if (sVar1 == 0) goto LAB_0096aa3a;
      lVar6 = lVar6 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    break;
  case FLOAT64:
    if (bVar2) goto LAB_0096aa82;
    pcVar5 = L"FLOAT64";
    if (shortName) {
      pcVar5 = L"D";
    }
    lVar6 = 0;
    do {
      sVar1 = *(short *)((long)pcVar5 + lVar6);
      *(short *)((long)buf + lVar6) = sVar1;
      if (sVar1 == 0) goto LAB_0096aa3a;
      lVar6 = lVar6 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    break;
  case SIMD:
    if (bVar2) goto LAB_0096aa82;
    lVar6 = 0;
    do {
      sVar1 = *(short *)((long)L"SIMD" + lVar6);
      *(short *)((long)buf + lVar6) = sVar1;
      if (sVar1 == 0) goto LAB_0096aa3a;
      lVar6 = lVar6 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    break;
  default:
    if (bVar2) goto LAB_0096aa82;
    lVar6 = 0;
    do {
      sVar1 = *(short *)((long)L"UNKNOWN" + lVar6);
      *(short *)((long)buf + lVar6) = sVar1;
      if (sVar1 == 0) goto LAB_0096aa3a;
      lVar6 = lVar6 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = 0;
LAB_0096aa3a:
  if (uVar3 != 0) {
    uVar3 = (uVar4 - uVar3) + 1;
    if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
      return;
    }
    memset(buf + uVar3,0xfd,(uVar4 - uVar3) * 2);
    return;
  }
  *buf = L'\0';
  if (1 < bufsize) {
    memset(buf + 1,0xfd,uVar4 * 2 - 2);
  }
LAB_0096aa82:
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return;
}

Assistant:

void RegisterSpace::GetTypeDebugName(Types type, char16* buf, uint bufsize, bool shortName)
    {
        // Since this needs to be done manually for each type, this assert will make sure to not forget to update this if a new type is added
        CompileAssert(LIMIT == 5);

        switch (type)
        {
        case INT32: wcscpy_s(buf, bufsize  , shortName ? _u("I"): _u("INT32")); break;
        case INT64: wcscpy_s(buf, bufsize  , shortName ? _u("L"): _u("INT64")); break;
        case FLOAT32: wcscpy_s(buf, bufsize, shortName ? _u("F"): _u("FLOAT32")); break;
        case FLOAT64: wcscpy_s(buf, bufsize, shortName ? _u("D"): _u("FLOAT64")); break;
        case SIMD: wcscpy_s(buf, bufsize   , _u("SIMD")); break;
        default: wcscpy_s(buf, bufsize     , _u("UNKNOWN")); break;
        }
    }